

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  bool local_409;
  bool local_3c9;
  allocator<char> local_399;
  string local_398;
  string local_378 [8];
  string saveFile;
  string file;
  string dir;
  string local_310;
  undefined1 local_2f0 [8];
  string makeProgram;
  string local_2b0 [32];
  ostringstream local_290 [8];
  ostringstream err;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string setMakeProgram;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    setMakeProgram.field_2._M_local_buf[0xe] = '\0';
    setMakeProgram.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_MAKE_PROGRAM",&local_79);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_78);
    pcVar1 = local_20;
    local_3c9 = true;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      setMakeProgram.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"CMAKE_MAKE_PROGRAM",
                 (allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf));
      setMakeProgram.field_2._M_local_buf[0xd] = '\x01';
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_a0);
      local_3c9 = cmSystemTools::IsOff(pcVar3);
    }
    if ((setMakeProgram.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if ((setMakeProgram.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (local_3c9 != false) {
      cmMakefile::GetModulesFile((string *)local_c8,local_20,&this->FindMakeProgramFile);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        cmMakefile::ReadListFile(local_20,(string *)local_c8);
      }
      std::__cxx11::string::~string((string *)local_c8);
    }
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"CMAKE_MAKE_PROGRAM",&local_e9);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_e8);
    pcVar1 = local_20;
    local_409 = true;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"CMAKE_MAKE_PROGRAM",&local_111);
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_110);
      local_409 = cmSystemTools::IsOff(pcVar3);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    pcVar1 = local_20;
    if (local_409 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"CMAKE_MAKE_PROGRAM",
                 (allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_310);
      std::__cxx11::string::string((string *)local_2f0,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      lVar6 = std::__cxx11::string::find((char)local_2f0,0x20);
      if (lVar6 != -1) {
        std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(saveFile.field_2._M_local_buf + 8));
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2f0,(string *)(file.field_2._M_local_buf + 8),
                   (string *)(saveFile.field_2._M_local_buf + 8),true);
        std::__cxx11::string::string(local_378,(string *)(saveFile.field_2._M_local_buf + 8));
        cmsys::SystemTools::GetShortPath((string *)local_2f0,(string *)local_2f0);
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2f0,(string *)((long)&file.field_2 + 8),
                   (string *)((long)&saveFile.field_2 + 8),true);
        std::__cxx11::string::operator=
                  ((string *)local_2f0,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_2f0,"/");
        std::__cxx11::string::operator+=((string *)local_2f0,local_378);
        pcVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"CMAKE_MAKE_PROGRAM",&local_399);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(pcVar1,&local_398,pcVar3,"make program",FILEPATH,false);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::string::~string((string *)(saveFile.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_2f0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_290);
      poVar4 = std::operator<<((ostream *)local_290,
                               "CMake was unable to find a build program corresponding to \"");
      (*this->_vptr_cmGlobalGenerator[3])(local_2b0);
      poVar4 = std::operator<<(poVar4,local_2b0);
      poVar4 = std::operator<<(poVar4,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
      std::operator<<(poVar4,"probably need to select a different build tool.");
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)((long)&makeProgram.field_2 + 8));
      std::__cxx11::string::~string((string *)(makeProgram.field_2._M_local_buf + 8));
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_290);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,&local_41);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (this->FindMakeProgramFile.empty()) {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    return false;
  }
  if (!mf->GetDefinition("CMAKE_MAKE_PROGRAM") ||
      cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::string setMakeProgram = mf->GetModulesFile(this->FindMakeProgramFile);
    if (!setMakeProgram.empty()) {
      mf->ReadListFile(setMakeProgram);
    }
  }
  if (!mf->GetDefinition("CMAKE_MAKE_PROGRAM") ||
      cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if (makeProgram.find(' ') != std::string::npos) {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    makeProgram = dir;
    makeProgram += "/";
    makeProgram += saveFile;
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram.c_str(),
                           "make program", cmStateEnums::FILEPATH);
  }
  return true;
}